

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O1

void __thiscall libtorrent::aux::torrent::on_tracker_announce(torrent *this,error_code *ec)

{
  this->m_waiting_tracker = this->m_waiting_tracker + -1;
  if ((ec->failed_ == false) && (((this->super_torrent_hot_members).field_0x4b & 4) == 0)) {
    announce_with_tracker(this,none);
  }
  return;
}

Assistant:

void torrent::on_tracker_announce(error_code const& ec) try
	{
		COMPLETE_ASYNC("tracker::on_tracker_announce");
		TORRENT_ASSERT(is_single_thread());
		TORRENT_ASSERT(m_waiting_tracker > 0);
		--m_waiting_tracker;
		if (ec) return;
		if (m_abort) return;
		announce_with_tracker();
	}
	catch (...) { handle_exception(); }